

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

size_type __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::erase(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        *this,key_type *key)

{
  iterator pos;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>,_unsigned_long>
  local_38;
  
  InnerMap::FindHelper(&local_38,this->elements_,key,(TreeIterator *)0x0);
  if (local_38.first.node_ != (Node *)0x0) {
    pos.it_.m_ = local_38.first.m_;
    pos.it_.node_ = local_38.first.node_;
    pos.it_.bucket_index_ = local_38.first.bucket_index_;
    erase((iterator *)&local_38,this,pos);
  }
  return (ulong)(local_38.first.node_ != (Node *)0x0);
}

Assistant:

size_type erase(const key_type& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }